

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O0

int ComputeError(sunrealtype t,N_Vector y,N_Vector e,sunrealtype *ec,UserData udata)

{
  int iVar1;
  N_Vector y_00;
  sunrealtype in_RCX;
  double *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int retval;
  sunrealtype *ydata;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_4;
  
  y_00 = (N_Vector)N_VGetArrayPointer(in_RDI);
  iVar1 = ComputeSolution(in_RCX,y_00,
                          (UserData)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  iVar1 = check_retval(y_00,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc);
  if (iVar1 == 0) {
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,in_RDI,in_RSI,in_RSI);
    *in_RDX = ((double)y_00->content * (double)y_00->content + (double)y_00->ops * (double)y_00->ops
              ) - 1.0;
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int ComputeError(sunrealtype t, N_Vector y, N_Vector e, sunrealtype* ec,
                        UserData udata)
{
  sunrealtype* ydata = N_VGetArrayPointer(y);
  int retval;

  /* solution error */
  retval = ComputeSolution(t, e, udata);
  if (check_retval(&retval, "ComputeSolution", 1)) { return (1); }
  N_VLinearSum(ONE, y, -ONE, e, e);

  /* constraint error */
  *ec = ydata[0] * ydata[0] + ydata[1] * ydata[1] - ONE;

  return (0);
}